

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::Read(ON_RevSurface *this,ON_BinaryArchive *file)

{
  ON_Interval *t;
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  double *pdVar4;
  char bHaveCurve;
  int bTransposedAsInt;
  ON_Object *obj;
  int minor_version;
  int major_version;
  char local_45;
  uint local_44;
  double local_40;
  ON_Object *local_38;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = 0;
  local_45 = '\0';
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_2c,&local_30);
  if (local_2c == 1 && bVar1) {
    ON_BinaryArchive::ReadLine(file,&this->m_axis);
    t = &this->m_angle;
    ON_BinaryArchive::ReadInterval(file,t);
    ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox);
    local_44 = (uint)this->m_bTransposed;
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_44);
    if (bVar1) {
      this->m_bTransposed = local_44 != 0;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&local_45);
    if (local_45 != '\0') {
      local_38 = (ON_Object *)0x0;
      iVar2 = ON_BinaryArchive::ReadObject(file,&local_38);
      bVar1 = iVar2 != 0;
      if (local_38 != (ON_Object *)0x0) {
        pOVar3 = ON_Curve::Cast(local_38);
        this->m_curve = pOVar3;
        if ((pOVar3 == (ON_Curve *)0x0) && (local_38 != (ON_Object *)0x0)) {
          (*local_38->_vptr_ON_Object[4])();
        }
      }
    }
    local_40 = ON_Interval::Min(t);
    pdVar4 = ON_Interval::operator[](&this->m_t,0);
    *pdVar4 = local_40;
    local_40 = ON_Interval::Max(t);
    pdVar4 = ON_Interval::operator[](&this->m_t,1);
    *pdVar4 = local_40;
  }
  else if (local_2c == 2 && bVar1) {
    ON_BinaryArchive::ReadLine(file,&this->m_axis);
    ON_BinaryArchive::ReadInterval(file,&this->m_angle);
    ON_BinaryArchive::ReadInterval(file,&this->m_t);
    ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox);
    local_44 = (uint)this->m_bTransposed;
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_44);
    if (bVar1) {
      this->m_bTransposed = local_44 != 0;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&local_45);
    if (local_45 != '\0') {
      local_38 = (ON_Object *)0x0;
      iVar2 = ON_BinaryArchive::ReadObject(file,&local_38);
      bVar1 = iVar2 != 0;
      if (local_38 != (ON_Object *)0x0) {
        pOVar3 = ON_Curve::Cast(local_38);
        this->m_curve = pOVar3;
        if ((pOVar3 == (ON_Curve *)0x0) && (local_38 != (ON_Object *)0x0)) {
          (*local_38->_vptr_ON_Object[4])();
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_RevSurface::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  char bHaveCurve = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version == 1) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc)
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
    m_t[0] = m_angle.Min();
    m_t[1] = m_angle.Max();
  }
  else if (rc && major_version == 2) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadInterval( m_t );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc) 
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
  }
  return rc;
}